

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1b21075::PeerManagerImpl::MaybePunishNodeForBlock
          (PeerManagerImpl *this,NodeId nodeid,BlockValidationState *state,bool via_compact_block,
          string *message)

{
  string_view source_file;
  bool bVar1;
  BlockValidationResult BVar2;
  element_type *peVar3;
  undefined1 in_CL;
  size_t in_RSI;
  PeerManagerImpl *in_R8;
  long in_FS_OFFSET;
  string_view in_stack_00000000;
  PeerRef peer;
  Level in_stack_000000e0;
  long *in_stack_000000f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_000000f8;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  char *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff58;
  undefined6 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6e;
  undefined1 in_stack_ffffffffffffff6f;
  NodeId in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  Peer *in_stack_ffffffffffffff98;
  undefined3 in_stack_ffffffffffffffac;
  uint source_line;
  ConstevalFormatString<2U> in_stack_ffffffffffffffe8;
  char *pcVar4;
  
  pcVar4 = *(char **)(in_FS_OFFSET + 0x28);
  source_line = CONCAT13(in_CL,in_stack_ffffffffffffffac) & 0x1ffffff;
  GetPeerRef((PeerManagerImpl *)
             CONCAT17(in_stack_ffffffffffffff6f,
                      CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)),
             in_stack_ffffffffffffff88);
  BVar2 = ValidationState<BlockValidationResult>::GetResult
                    ((ValidationState<BlockValidationResult> *)
                     CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  switch(BVar2) {
  case BLOCK_RESULT_UNSET:
    break;
  case BLOCK_CONSENSUS:
  case BLOCK_MUTATED:
    if ((source_line & 0x1000000) == 0) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2> *)
                         CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      if (bVar1) {
        std::
        __shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator*((__shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)in_stack_ffffffffffffff48);
        Misbehaving(in_R8,in_stack_ffffffffffffff98,
                    (string *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      }
      goto LAB_01079fe8;
    }
    break;
  case BLOCK_RECENT_CONSENSUS_CHANGE:
  case BLOCK_TIME_FUTURE:
    break;
  case BLOCK_CACHED_INVALID:
    bVar1 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2> *)
                       CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    if (((bVar1) && ((source_line & 0x1000000) == 0)) &&
       (peVar3 = std::
                 __shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)),
       (peVar3->m_is_inbound & 1U) == 0)) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2> *)
                         CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      if (bVar1) {
        std::
        __shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator*((__shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)in_stack_ffffffffffffff48);
        Misbehaving(in_R8,in_stack_ffffffffffffff98,
                    (string *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      }
      goto LAB_01079fe8;
    }
    break;
  case BLOCK_INVALID_HEADER:
  case BLOCK_INVALID_PREV:
  case BLOCK_CHECKPOINT:
    bVar1 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2> *)
                       CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    if (bVar1) {
      std::
      __shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator*((__shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)in_stack_ffffffffffffff48);
      Misbehaving(in_R8,in_stack_ffffffffffffff98,
                  (string *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    }
    goto LAB_01079fe8;
  case BLOCK_MISSING_PREV:
    bVar1 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2> *)
                       CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    if (bVar1) {
      std::
      __shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator*((__shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)in_stack_ffffffffffffff48);
      Misbehaving(in_R8,in_stack_ffffffffffffff98,
                  (string *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    }
    goto LAB_01079fe8;
  case BLOCK_HEADER_LOW_WORK:
  }
  bVar1 = std::operator==(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  if ((((bVar1 ^ 0xffU) & 1) != 0) &&
     (bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                                  Trace), bVar1)) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    in_stack_ffffffffffffff38 = 1;
    source_file._M_str = pcVar4;
    source_file._M_len = in_RSI;
    LogPrintFormatInternal<long,std::__cxx11::string>
              (in_stack_00000000,source_file,source_line,(LogFlags)in_R8,in_stack_000000e0,
               in_stack_ffffffffffffffe8,in_stack_000000f0,in_stack_000000f8);
  }
LAB_01079fe8:
  std::shared_ptr<(anonymous_namespace)::Peer>::~shared_ptr
            ((shared_ptr<(anonymous_namespace)::Peer> *)
             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  if (*(char **)(in_FS_OFFSET + 0x28) != pcVar4) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PeerManagerImpl::MaybePunishNodeForBlock(NodeId nodeid, const BlockValidationState& state,
                                              bool via_compact_block, const std::string& message)
{
    PeerRef peer{GetPeerRef(nodeid)};
    switch (state.GetResult()) {
    case BlockValidationResult::BLOCK_RESULT_UNSET:
        break;
    case BlockValidationResult::BLOCK_HEADER_LOW_WORK:
        // We didn't try to process the block because the header chain may have
        // too little work.
        break;
    // The node is providing invalid data:
    case BlockValidationResult::BLOCK_CONSENSUS:
    case BlockValidationResult::BLOCK_MUTATED:
        if (!via_compact_block) {
            if (peer) Misbehaving(*peer, message);
            return;
        }
        break;
    case BlockValidationResult::BLOCK_CACHED_INVALID:
        {
            // Discourage outbound (but not inbound) peers if on an invalid chain.
            // Exempt HB compact block peers. Manual connections are always protected from discouragement.
            if (peer && !via_compact_block && !peer->m_is_inbound) {
                if (peer) Misbehaving(*peer, message);
                return;
            }
            break;
        }
    case BlockValidationResult::BLOCK_INVALID_HEADER:
    case BlockValidationResult::BLOCK_CHECKPOINT:
    case BlockValidationResult::BLOCK_INVALID_PREV:
        if (peer) Misbehaving(*peer, message);
        return;
    // Conflicting (but not necessarily invalid) data or different policy:
    case BlockValidationResult::BLOCK_MISSING_PREV:
        if (peer) Misbehaving(*peer, message);
        return;
    case BlockValidationResult::BLOCK_RECENT_CONSENSUS_CHANGE:
    case BlockValidationResult::BLOCK_TIME_FUTURE:
        break;
    }
    if (message != "") {
        LogDebug(BCLog::NET, "peer=%d: %s\n", nodeid, message);
    }
}